

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O1

void vkt::pipeline::anon_unknown_0::renderMultisampledImage
               (Context *context,CaseDef *caseDef,VkImage colorImage)

{
  int *piVar1;
  VkAttachmentStoreOp *pVVar2;
  int iVar3;
  VkFormat format;
  undefined4 uVar4;
  undefined8 uVar5;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var6;
  undefined4 uVar7;
  VkImageSubresourceRange subresourceRange;
  VkFramebuffer obj;
  VkPipelineBindPoint VVar8;
  undefined8 commandBuffer;
  undefined8 uVar9;
  void *pvVar10;
  undefined8 uVar11;
  VkDeviceSize VVar12;
  bool bVar13;
  deUint32 dVar14;
  VkResult result;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  Allocator *allocator;
  deUint64 *pdVar15;
  const_iterator cVar16;
  long lVar17;
  undefined8 uVar18;
  ulong uVar19;
  VkSubpassDescription *pVVar20;
  pointer pVVar21;
  long lVar22;
  VkDeviceSize bufferSize;
  ulong __n;
  byte bVar23;
  VkBufferCreateInfo bufferCreateInfo;
  VkAttachmentDescription colorAttachmentDescription;
  vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> subpasses;
  vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> clearValues;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  attachmentHandles;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipelines;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  Move<vk::Handle<(vk::HandleType)13>_> local_168;
  VkImageSubresourceRange res;
  Move<vk::Handle<(vk::HandleType)17>_> local_128;
  VkRenderPass local_108;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_100;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  colorAttachments;
  VkBuffer local_b8;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_b0;
  VkShaderModule local_98;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_90;
  VkShaderModule local_78;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_70;
  VkCommandPool local_58;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_50;
  IVec2 local_38;
  
  bVar23 = 0;
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  queue = Context::getUniversalQueue(context);
  dVar14 = Context::getUniversalQueueFamilyIndex(context);
  allocator = Context::getDefaultAllocator(context);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&bufferCreateInfo,vk,device,2,dVar14,
             (VkAllocationCallbacks *)0x0);
  DStack_50.m_device = (VkDevice)bufferCreateInfo._16_8_;
  DStack_50.m_allocator = (VkAllocationCallbacks *)bufferCreateInfo.size;
  local_58.m_internal = bufferCreateInfo._0_8_;
  DStack_50.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&bufferCreateInfo,vk,device,
                    (VkCommandPool)bufferCreateInfo._0_8_);
  VVar12 = bufferCreateInfo.size;
  uVar11 = bufferCreateInfo._16_8_;
  pvVar10 = bufferCreateInfo.pNext;
  commandBuffer = bufferCreateInfo._0_8_;
  uVar5 = *(undefined8 *)(caseDef->renderSize).m_data;
  colorAttachments.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  colorAttachments.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  colorAttachments.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attachmentHandles.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attachmentHandles.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attachmentHandles.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (0 < caseDef->numLayers) {
    dVar14 = 0;
    do {
      res.aspectMask = 1;
      res.baseMipLevel = 0;
      res.levelCount = 1;
      res.layerCount = 1;
      subresourceRange.levelCount = 1;
      subresourceRange.aspectMask = 1;
      subresourceRange.baseMipLevel = 0;
      subresourceRange.baseArrayLayer = dVar14;
      subresourceRange.layerCount = 1;
      res.baseArrayLayer = dVar14;
      makeImageView(&local_168,vk,device,colorImage,VK_IMAGE_VIEW_TYPE_2D,caseDef->colorFormat,
                    subresourceRange);
      pdVar15 = (deUint64 *)operator_new(0x20);
      pdVar15[2] = (deUint64)
                   local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
      pdVar15[3] = (deUint64)
                   local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                   m_allocator;
      *pdVar15 = local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
      pdVar15[1] = (deUint64)
                   local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                   m_deviceIface;
      local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
      local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      bufferCreateInfo.pNext = (void *)0x0;
      bufferCreateInfo._0_8_ = pdVar15;
      bufferCreateInfo.pNext = operator_new(0x20);
      *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 0;
      *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 0;
      *(undefined ***)bufferCreateInfo.pNext = &PTR__SharedPtrState_00d53520;
      *(deUint64 **)((long)bufferCreateInfo.pNext + 0x10) = pdVar15;
      *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 1;
      *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 1;
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
      ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>
                ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
                  *)&colorAttachments,
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                 &bufferCreateInfo);
      if (bufferCreateInfo.pNext != (void *)0x0) {
        LOCK();
        piVar1 = (int *)((long)bufferCreateInfo.pNext + 8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          bufferCreateInfo._4_4_ = 0;
          (**(code **)(*bufferCreateInfo.pNext + 0x10))();
        }
        LOCK();
        piVar1 = (int *)((long)bufferCreateInfo.pNext + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (bufferCreateInfo.pNext != (void *)0x0) {
            (**(code **)(*bufferCreateInfo.pNext + 8))();
          }
          bufferCreateInfo.pNext = (void *)0x0;
        }
      }
      if (local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                  (&local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                   (VkImageView)
                   local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
                  );
      }
      local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
      local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      if (attachmentHandles.
          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          attachmentHandles.
          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<vk::Handle<(vk::HandleType)13>,std::allocator<vk::Handle<(vk::HandleType)13>>>::
        _M_realloc_insert<vk::Handle<(vk::HandleType)13>const&>
                  ((vector<vk::Handle<(vk::HandleType)13>,std::allocator<vk::Handle<(vk::HandleType)13>>>
                    *)&attachmentHandles,
                   (iterator)
                   attachmentHandles.
                   super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (Handle<(vk::HandleType)13> *)
                   colorAttachments.
                   super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr);
      }
      else {
        (attachmentHandles.
         super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->m_internal =
             ((colorAttachments.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->
             super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
        attachmentHandles.
        super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             attachmentHandles.
             super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      dVar14 = dVar14 + 1;
    } while ((int)dVar14 < caseDef->numLayers);
  }
  if (pipeline::(anonymous_namespace)::genTriangleVertices()::data == '\0') {
    _GLOBAL__N_1::renderMultisampledImage();
  }
  std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
  vector<vkt::pipeline::Vertex4RGBA_const*,void>
            ((vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *)
             &vertices,(Vertex4RGBA *)pipeline::(anonymous_namespace)::genTriangleVertices()::data,
             (Vertex4RGBA *)&pipeline::(anonymous_namespace)::genTriangleVertices()::data,
             (allocator_type *)&bufferCreateInfo);
  bufferSize = (long)vertices.
                     super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)vertices.
                     super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  makeBufferCreateInfo(&bufferCreateInfo,bufferSize,0x80);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&colorAttachmentDescription,vk,device,
                     &bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  local_b8.m_internal._4_4_ = colorAttachmentDescription.format;
  local_b8.m_internal._0_4_ = colorAttachmentDescription.flags;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,vk,
             device,allocator,local_b8,(MemoryRequirement)0x1);
  uVar9 = bufferCreateInfo._0_8_;
  memcpy(*(void **)(bufferCreateInfo._0_8_ + 0x18),
         vertices.
         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
         ._M_impl.super__Vector_impl_data._M_start,bufferSize);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar9 + 8),*(VkDeviceSize *)(uVar9 + 0x10),
             bufferSize);
  p_Var6 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  pVVar2 = &colorAttachmentDescription.storeOp;
  colorAttachmentDescription._0_8_ = pVVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&colorAttachmentDescription,"vert","");
  cVar16 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var6,(key_type *)&colorAttachmentDescription);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo,vk,device,
             *(ProgramBinary **)(cVar16._M_node + 2),0);
  DStack_70.m_device = (VkDevice)bufferCreateInfo._16_8_;
  DStack_70.m_allocator = (VkAllocationCallbacks *)bufferCreateInfo.size;
  local_78.m_internal = bufferCreateInfo._0_8_;
  DStack_70.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  if ((VkAttachmentStoreOp *)colorAttachmentDescription._0_8_ != pVVar2) {
    operator_delete((void *)colorAttachmentDescription._0_8_,
                    CONCAT44(colorAttachmentDescription.stencilLoadOp,
                             colorAttachmentDescription.storeOp) + 1);
  }
  p_Var6 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  colorAttachmentDescription._0_8_ = pVVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&colorAttachmentDescription,"frag","");
  cVar16 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var6,(key_type *)&colorAttachmentDescription);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo,vk,device,
             *(ProgramBinary **)(cVar16._M_node + 2),0);
  DStack_90.m_device = (VkDevice)bufferCreateInfo._16_8_;
  DStack_90.m_allocator = (VkAllocationCallbacks *)bufferCreateInfo.size;
  local_98.m_internal = bufferCreateInfo._0_8_;
  DStack_90.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  if ((VkAttachmentStoreOp *)colorAttachmentDescription._0_8_ != pVVar2) {
    operator_delete((void *)colorAttachmentDescription._0_8_,
                    CONCAT44(colorAttachmentDescription.stencilLoadOp,
                             colorAttachmentDescription.storeOp) + 1);
  }
  uVar4 = caseDef->colorFormat;
  uVar7 = caseDef->numSamples;
  __n = (ulong)(uint)caseDef->numLayers;
  colorAttachmentDescription.flags = 0;
  colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
  colorAttachmentDescription.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  colorAttachmentDescription.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
  colorAttachmentDescription.stencilStoreOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
  colorAttachmentDescription.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentDescription.finalLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  colorAttachmentDescription.format = uVar4;
  colorAttachmentDescription.samples = uVar7;
  std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::vector
            ((vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_> *)
             &pipelines,__n,&colorAttachmentDescription,(allocator_type *)&bufferCreateInfo);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::vector
            ((vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> *)
             &clearValues,__n,(allocator_type *)&bufferCreateInfo);
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (__n != 0) {
    lVar22 = 0;
    uVar19 = 0;
    do {
      *(int *)((long)clearValues.
                     super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl
                     .super__Vector_impl_data._M_start + lVar22) = (int)uVar19;
      *(undefined4 *)
       ((long)clearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar22 + 4) = 2;
      bufferCreateInfo.flags = 0;
      bufferCreateInfo._20_4_ = 0;
      bufferCreateInfo.queueFamilyIndexCount = 0;
      bufferCreateInfo._44_4_ = 0;
      bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)0x0;
      bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      bufferCreateInfo._4_4_ = 0;
      bufferCreateInfo.pNext = (void *)0x0;
      bufferCreateInfo.size = 1;
      bufferCreateInfo._32_8_ =
           (long)clearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar22;
      if (subpasses.
          super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          subpasses.
          super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>>::
        _M_realloc_insert<vk::VkSubpassDescription_const&>
                  ((vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>> *)
                   &subpasses,
                   (iterator)
                   subpasses.
                   super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (VkSubpassDescription *)&bufferCreateInfo);
      }
      else {
        pVVar20 = (VkSubpassDescription *)&bufferCreateInfo;
        pVVar21 = subpasses.
                  super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
          VVar8 = pVVar20->pipelineBindPoint;
          pVVar21->flags = pVVar20->flags;
          pVVar21->pipelineBindPoint = VVar8;
          pVVar20 = (VkSubpassDescription *)((long)pVVar20 + (ulong)bVar23 * -0x10 + 8);
          pVVar21 = (pointer)((long)pVVar21 + (ulong)bVar23 * -0x10 + 8);
        }
        subpasses.
        super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             subpasses.
             super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      uVar19 = uVar19 + 1;
      lVar22 = lVar22 + 8;
    } while (__n != uVar19);
  }
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo._16_8_ =
       (ulong)(uint)((int)((ulong)((long)pipelines.
                                         super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)pipelines.
                                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                    0x38e38e39) << 0x20;
  bufferCreateInfo.size =
       (VkDeviceSize)
       pipelines.
       super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  bufferCreateInfo.usage =
       (int)((ulong)((long)subpasses.
                           super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)subpasses.
                          super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
  bufferCreateInfo._40_8_ =
       subpasses.
       super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
       _M_impl.super__Vector_impl_data._M_start;
  bufferCreateInfo.pQueueFamilyIndices =
       (deUint32 *)((ulong)bufferCreateInfo.pQueueFamilyIndices._4_4_ << 0x20);
  ::vk::createRenderPass
            (&local_128,vk,device,(VkRenderPassCreateInfo *)&bufferCreateInfo,
             (VkAllocationCallbacks *)0x0);
  if (subpasses.
      super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(subpasses.
                    super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)subpasses.
                          super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)subpasses.
                          super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (clearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(clearValues.
                    super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)clearValues.
                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)clearValues.
                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelines.
      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelines.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pipelines.
                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelines.
                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_108.m_internal =
       local_128.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  DStack_100.m_deviceIface =
       local_128.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
  DStack_100.m_device =
       local_128.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
  DStack_100.m_allocator =
       local_128.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&bufferCreateInfo,vk,device,
                  (VkRenderPass)
                  local_128.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal,
                  caseDef->numLayers,
                  attachmentHandles.
                  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,(caseDef->renderSize).m_data[0],
                  (caseDef->renderSize).m_data[1],1);
  colorAttachmentDescription.storeOp = bufferCreateInfo.flags;
  colorAttachmentDescription.stencilLoadOp = bufferCreateInfo._20_4_;
  colorAttachmentDescription.stencilStoreOp = (VkAttachmentStoreOp)bufferCreateInfo.size;
  colorAttachmentDescription.initialLayout = (VkImageLayout)(bufferCreateInfo.size >> 0x20);
  colorAttachmentDescription.flags = bufferCreateInfo.sType;
  colorAttachmentDescription.format = bufferCreateInfo._4_4_;
  colorAttachmentDescription.samples = (VkSampleCountFlagBits)bufferCreateInfo.pNext;
  colorAttachmentDescription.loadOp = (VkAttachmentLoadOp)((ulong)bufferCreateInfo.pNext >> 0x20);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&bufferCreateInfo,vk,device);
  local_128.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)bufferCreateInfo._16_8_;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)bufferCreateInfo.size;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
       bufferCreateInfo._0_8_;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)bufferCreateInfo.pNext;
  local_38.m_data = *&(caseDef->renderSize).m_data;
  makeGraphicsPipelines
            (&pipelines,vk,device,caseDef->numLayers,(VkPipelineLayout)bufferCreateInfo._0_8_,
             local_108,local_78,local_98,&local_38,caseDef->numSamples,
             VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);
  beginCommandBuffer(vk,(VkCommandBuffer)commandBuffer);
  iVar3 = caseDef->numLayers;
  format = caseDef->colorFormat;
  bVar13 = ::vk::isUintFormat(format);
  if (bVar13) {
    bufferCreateInfo.pNext = (void *)0x6000000040;
    bufferCreateInfo.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
    bufferCreateInfo._4_4_ = 0x20;
  }
  else {
    bVar13 = ::vk::isIntFormat(format);
    uVar18._0_4_ = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    uVar18._4_4_ = 0;
    bufferCreateInfo.pNext = (void *)0x3f8000003f800000;
    if (bVar13) {
      bufferCreateInfo.pNext = (void *)0x6000000040;
    }
    bufferCreateInfo.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
    bufferCreateInfo._4_4_ = 0x20;
    if (!bVar13) {
      bufferCreateInfo._0_8_ = uVar18;
    }
  }
  std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::vector
            (&clearValues,(long)iVar3,(value_type *)&bufferCreateInfo,(allocator_type *)&subpasses);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo._16_8_ = local_108.m_internal;
  bufferCreateInfo.size =
       CONCAT44(colorAttachmentDescription.format,colorAttachmentDescription.flags);
  bufferCreateInfo.usage = 0;
  bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.pQueueFamilyIndices =
       (deUint32 *)
       CONCAT44(bufferCreateInfo.pQueueFamilyIndices._4_4_,
                (int)((ulong)((long)clearValues.
                                    super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)clearValues.
                                   super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4));
  bufferCreateInfo._40_8_ = uVar5;
  (*vk->_vptr_DeviceInterface[0x74])(vk,commandBuffer,&bufferCreateInfo,0);
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (*vk->_vptr_DeviceInterface[0x58])(vk,commandBuffer,0,1,&local_b8);
  if (0 < caseDef->numLayers) {
    lVar17 = 0;
    lVar22 = 0;
    do {
      if (lVar17 != 0) {
        (*vk->_vptr_DeviceInterface[0x75])(vk,commandBuffer,0);
      }
      (*vk->_vptr_DeviceInterface[0x4c])
                (vk,commandBuffer,0,
                 **(undefined8 **)
                   ((long)&(pipelines.
                            super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar17));
      (*vk->_vptr_DeviceInterface[0x59])
                (vk,commandBuffer,
                 (ulong)((long)vertices.
                               super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)vertices.
                              super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5,1,0,0);
      lVar22 = lVar22 + 1;
      lVar17 = lVar17 + 0x10;
    } while (lVar22 < caseDef->numLayers);
  }
  (*vk->_vptr_DeviceInterface[0x76])(vk,commandBuffer);
  result = (*vk->_vptr_DeviceInterface[0x4a])(vk,commandBuffer);
  ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineMultisampleImageTests.cpp"
                    ,0x34d);
  submitCommandsAndWait(vk,device,queue,(VkCommandBuffer)commandBuffer);
  if (clearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(clearValues.
                    super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)clearValues.
                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)clearValues.
                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::~vector(&pipelines);
  if (local_128.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)
               &local_128.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               (VkPipelineLayout)
               local_128.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal);
  }
  obj.m_internal._4_4_ = colorAttachmentDescription.format;
  obj.m_internal._0_4_ = colorAttachmentDescription.flags;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)&colorAttachmentDescription.samples,obj);
  }
  if (local_108.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()(&DStack_100,local_108);
  }
  if (local_98.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_90,local_98);
  }
  if (local_78.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_70,local_78);
  }
  if (uVar9 != 0) {
    (**(code **)(*(long *)uVar9 + 8))();
  }
  if (local_b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_b0,local_b8);
  }
  if (vertices.
      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vertices.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vertices.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (attachmentHandles.
      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attachmentHandles.
                    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)attachmentHandles.
                          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)attachmentHandles.
                          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::~vector(&colorAttachments);
  if (commandBuffer != 0) {
    bufferCreateInfo._0_8_ = commandBuffer;
    (**(code **)(*pvVar10 + 0x240))(pvVar10,uVar11,VVar12,1);
  }
  if (local_58.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_50,local_58);
  }
  return;
}

Assistant:

void renderMultisampledImage (Context& context, const CaseDef& caseDef, const VkImage colorImage)
{
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&						allocator			= context.getDefaultAllocator();

	const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer			(makeCommandBuffer(vk, device, *cmdPool));

	const VkRect2D renderArea = {
		makeOffset2D(0, 0),
		makeExtent2D(caseDef.renderSize.x(), caseDef.renderSize.y()),
	};

	{
		// Create an image view (attachment) for each layer of the image
		std::vector<ImageViewSp>	colorAttachments;
		std::vector<VkImageView>	attachmentHandles;
		for (int i = 0; i < caseDef.numLayers; ++i)
		{
			colorAttachments.push_back(makeSharedPtr(makeImageView(
				vk, device, colorImage, VK_IMAGE_VIEW_TYPE_2D, caseDef.colorFormat, makeColorSubresourceRange(i, 1))));
			attachmentHandles.push_back(**colorAttachments.back());
		}

		// Vertex buffer
		const std::vector<Vertex4RGBA>	vertices			= genTriangleVertices();
		const VkDeviceSize				vertexBufferSize	= sizeInBytes(vertices);
		const Unique<VkBuffer>			vertexBuffer		(makeBuffer(vk, device, vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT));
		const UniquePtr<Allocation>		vertexBufferAlloc	(bindBuffer(vk, device, allocator, *vertexBuffer, MemoryRequirement::HostVisible));

		{
			deMemcpy(vertexBufferAlloc->getHostPtr(), &vertices[0], static_cast<std::size_t>(vertexBufferSize));
			flushMappedMemoryRange(vk, device, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset(), vertexBufferSize);
		}

		const Unique<VkShaderModule>	vertexModule	(createShaderModule			(vk, device, context.getBinaryCollection().get("vert"), 0u));
		const Unique<VkShaderModule>	fragmentModule	(createShaderModule			(vk, device, context.getBinaryCollection().get("frag"), 0u));
		const Unique<VkRenderPass>		renderPass		(makeMultisampleRenderPass	(vk, device, caseDef.colorFormat, caseDef.numSamples, caseDef.numLayers));
		const Unique<VkFramebuffer>		framebuffer		(makeFramebuffer			(vk, device, *renderPass, caseDef.numLayers, &attachmentHandles[0],
																					 static_cast<deUint32>(caseDef.renderSize.x()),  static_cast<deUint32>(caseDef.renderSize.y())));
		const Unique<VkPipelineLayout>	pipelineLayout	(makePipelineLayout			(vk, device));
		const std::vector<PipelineSp>	pipelines		(makeGraphicsPipelines		(vk, device, caseDef.numLayers, *pipelineLayout, *renderPass, *vertexModule, *fragmentModule,
																					 caseDef.renderSize, caseDef.numSamples, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST));

		beginCommandBuffer(vk, *cmdBuffer);

		const std::vector<VkClearValue> clearValues(caseDef.numLayers, getClearValue(caseDef.colorFormat));

		const VkRenderPassBeginInfo renderPassBeginInfo = {
			VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,		// VkStructureType         sType;
			DE_NULL,										// const void*             pNext;
			*renderPass,									// VkRenderPass            renderPass;
			*framebuffer,									// VkFramebuffer           framebuffer;
			renderArea,										// VkRect2D                renderArea;
			static_cast<deUint32>(clearValues.size()),		// uint32_t                clearValueCount;
			&clearValues[0],								// const VkClearValue*     pClearValues;
		};
		vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);

		{
			const VkDeviceSize vertexBufferOffset = 0ull;
			vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
		}

		for (int layerNdx = 0; layerNdx < caseDef.numLayers; ++layerNdx)
		{
			if (layerNdx != 0)
				vk.cmdNextSubpass(*cmdBuffer, VK_SUBPASS_CONTENTS_INLINE);

			vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, **pipelines[layerNdx]);

			vk.cmdDraw(*cmdBuffer, static_cast<deUint32>(vertices.size()), 1u, 0u, 0u);
		}

		vk.cmdEndRenderPass(*cmdBuffer);

		VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}
}